

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O0

void start_server(void)

{
  int iVar1;
  uv_loop_t *loop;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-queue-order.c"
            ,0x66,"uv_ip4_addr(\"0.0.0.0\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  loop = uv_default_loop();
  iVar1 = uv_tcp_init(loop,&server);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-queue-order.c"
            ,0x68,"uv_tcp_init(uv_default_loop(), &server)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_bind(&server,(sockaddr *)&eval_a,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-queue-order.c"
            ,0x69,"uv_tcp_bind(&server, (struct sockaddr*) &addr, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)&server,0x80,connection_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-queue-order.c"
            ,0x6a,"uv_listen((uv_stream_t*) &server, 128, connection_cb)","==","0",(long)iVar1,"==",
            0);
    abort();
  }
  return;
}

Assistant:

static void start_server(uv_loop_t* loop, uv_tcp_t* handle) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, handle);
  ASSERT_OK(r);

  r = uv_tcp_bind(handle, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*) handle, 128, on_connection);
  ASSERT_OK(r);

  uv_unref((uv_handle_t*) handle);
}